

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O1

QStringList * __thiscall
QInternalMimeData::formats(QStringList *__return_storage_ptr__,QInternalMimeData *this)

{
  char cVar1;
  long lVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QLatin1String QVar5;
  QStringView QVar6;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*(long *)this + 0x80))();
  QVar5.m_data = "application/x-qt-image";
  QVar5.m_size = 0x16;
  cVar1 = QtPrivate::QStringList_contains
                    ((QList_conflict *)__return_storage_ptr__,QVar5,CaseSensitive);
  if (cVar1 == '\0') {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QImageReader::supportedImageFormats();
    imageMimeFormats((QStringList *)&local_58,(QList<QByteArray> *)&local_38);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      lVar2 = 0x10;
      puVar3 = (undefined1 *)0x0;
      do {
        QVar6.m_data = *(storage_type_conflict **)((long)local_58.ptr + lVar2 + -8);
        QVar6.m_size = *(qsizetype *)((long)&((local_58.ptr)->d).d + lVar2);
        cVar1 = QtPrivate::QStringList_contains
                          ((QList_conflict *)__return_storage_ptr__,QVar6,CaseSensitive);
        if (cVar1 != '\0') {
          QVar4.m_data = (storage_type *)0x16;
          QVar4.m_size = (qsizetype)&local_38;
          QString::fromLatin1(QVar4);
          local_78.d.d = (Data *)local_38.d;
          local_78.d.ptr = (char16_t *)local_38.ptr;
          local_78.d.size = local_38.size;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_78);
          QList<QString>::end(__return_storage_ptr__);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          break;
        }
        puVar3 = puVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (puVar3 < (ulong)local_58.size);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QInternalMimeData::formats() const
{
    QStringList realFormats = formats_sys();
    if (!realFormats.contains("application/x-qt-image"_L1)) {
        QStringList imageFormats = imageReadMimeFormats();
        for (int i = 0; i < imageFormats.size(); ++i) {
            if (realFormats.contains(imageFormats.at(i))) {
                realFormats += "application/x-qt-image"_L1;
                break;
            }
        }
    }
    return realFormats;
}